

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O3

void libtorrent::aux::utp_stream::on_writeable(utp_stream *s,error_code *ec)

{
  function<void_(const_boost::system::error_code_&)> *pfVar1;
  _Manager_type p_Var2;
  _Manager_type *pp_Var3;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  undefined8 local_38;
  error_category *peStack_30;
  io_context *local_20;
  undefined4 local_14;
  
  local_20 = s->m_io_service;
  pfVar1 = &s->m_writeable_handler;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = (s->m_writeable_handler)._M_invoker;
  p_Var2 = (s->m_writeable_handler).super__Function_base._M_manager;
  pp_Var3 = &(s->m_writeable_handler).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor
    ;
    local_58._8_8_ =
         *(undefined8 *)((long)&(s->m_writeable_handler).super__Function_base._M_functor + 8);
    *pp_Var3 = (_Manager_type)0x0;
    (s->m_writeable_handler)._M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var2;
  }
  local_38._0_4_ = ec->val_;
  local_38._4_1_ = ec->failed_;
  local_38._5_3_ = *(undefined3 *)&ec->field_0x5;
  peStack_30 = ec->cat_;
  local_14 = 1;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<std::_Bind_result<void,std::function<void(boost::system::error_code_const&)>(boost::system::error_code)>>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_20,
             (_Bind_result<void,_std::function<void_(const_boost::system::error_code_&)>_(boost::system::error_code)>
              *)&local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (*pp_Var3 != (_Manager_type)0x0) {
    (**pp_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    *pp_Var3 = (_Manager_type)0x0;
    (s->m_writeable_handler)._M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

void utp_stream::on_writeable(utp_stream* s, error_code const& ec)
{
	UTP_LOGV("%8p: calling writeable handler ec:%s\n"
		, static_cast<void*>(s->m_impl)
		, ec.message().c_str());

	TORRENT_ASSERT(s->m_writeable_handler);
	post(s->m_io_service, std::bind<void>(std::move(s->m_writeable_handler), ec));
	s->m_writeable_handler = nullptr;
}